

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1016::run(TestCase1016 *this)

{
  int iVar1;
  Reader value;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  Fault f;
  Builder root;
  MallocMessageBuilder builder;
  PointerBuilder local_1a0;
  StructBuilder local_188;
  Builder local_158;
  StructBuilder local_140;
  MallocMessageBuilder local_118;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_118,6,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_1a0,&local_118.super_MessageBuilder);
  local_188.data = local_1a0.pointer;
  local_188.segment = local_1a0.segment;
  local_188.capTable = local_1a0.capTable;
  PointerBuilder::initStruct(&local_140,(PointerBuilder *)&local_188,(StructSize)0x10000);
  local_1a0.segment = local_140.segment;
  local_1a0.capTable = local_140.capTable;
  local_1a0.pointer = local_140.pointers;
  PointerBuilder::initStruct(&local_188,&local_1a0,(StructSize)0x20001);
  local_1a0.segment = local_188.segment;
  local_1a0.capTable = local_188.capTable;
  local_1a0.pointer = local_188.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>(&local_1a0,value);
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if ((AVar2.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0.segment = (SegmentBuilder *)CONCAT44(local_1a0.segment._4_4_,1);
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.segment = (SegmentBuilder *)AVar2.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x401,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               (uint *)&local_1a0,(unsigned_long *)&local_188);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if (((AVar2.ptr)->size_ != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0.segment = (SegmentBuilder *)CONCAT44(local_1a0.segment._4_4_,6);
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.segment = (SegmentBuilder *)(AVar2.ptr)->size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x402,ERROR,
               "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[0].size())\", 6u, builder.getSegmentsForOutput()[0].size()"
               ,(char (*) [68])"failed: expected (6u) == (builder.getSegmentsForOutput()[0].size())"
               ,(uint *)&local_1a0,(unsigned_long *)&local_188);
  }
  local_1a0.segment = local_140.segment;
  local_1a0.capTable = local_140.capTable;
  local_1a0.pointer = local_140.pointers;
  PointerBuilder::getStruct(&local_188,&local_1a0,(StructSize)0x30002,(word *)0x0);
  local_1a0.segment = local_188.segment;
  local_1a0.capTable = local_188.capTable;
  local_1a0.pointer = local_188.pointers;
  PointerBuilder::getBlob<capnp::Text>(&local_158,&local_1a0,(void *)0x0,0);
  if (((local_158.content.size_ != 4) || (iVar1 = bcmp(local_158.content.ptr,"foo",3), iVar1 != 0))
     && (kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getStruct(&local_188,&local_1a0,(StructSize)0x30002,(word *)0x0);
    local_1a0.segment = local_188.segment;
    local_1a0.capTable = local_188.capTable;
    local_1a0.pointer = local_188.pointers;
    PointerBuilder::getBlob<capnp::Text>(&local_158,&local_1a0,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[96],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x405,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2())\", \"foo\", root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2()"
               ,(char (*) [96])
                "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2())"
               ,(char (*) [4])"foo",&local_158);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if (AVar2.size_ != 3) {
    local_158._0_4_ = 3;
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_1a0.segment = (SegmentBuilder *)AVar2.size_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_long>
              ((Fault *)&local_188,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x409,FAILED,"(3u) == (builder.getSegmentsForOutput().size())",
               "3u, builder.getSegmentsForOutput().size()",(uint *)&local_158,
               (unsigned_long *)&local_1a0);
    kj::_::Debug::Fault::fatal((Fault *)&local_188);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if (((AVar2.ptr)->size_ != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0.segment = (SegmentBuilder *)CONCAT44(local_1a0.segment._4_4_,6);
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.segment = (SegmentBuilder *)(AVar2.ptr)->size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x40a,ERROR,
               "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[0].size())\", 6u, builder.getSegmentsForOutput()[0].size()"
               ,(char (*) [68])"failed: expected (6u) == (builder.getSegmentsForOutput()[0].size())"
               ,(uint *)&local_1a0,(unsigned_long *)&local_188);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if ((AVar2.ptr[1].size_ != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0.segment = (SegmentBuilder *)CONCAT44(local_1a0.segment._4_4_,6);
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.segment = (SegmentBuilder *)AVar2.ptr[1].size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x40b,ERROR,
               "\"failed: expected \" \"(6u) == (builder.getSegmentsForOutput()[1].size())\", 6u, builder.getSegmentsForOutput()[1].size()"
               ,(char (*) [68])"failed: expected (6u) == (builder.getSegmentsForOutput()[1].size())"
               ,(uint *)&local_1a0,(unsigned_long *)&local_188);
  }
  AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
  if ((AVar2.ptr[2].size_ != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_1a0.segment = (SegmentBuilder *)CONCAT44(local_1a0.segment._4_4_,2);
    AVar2 = MessageBuilder::getSegmentsForOutput(&local_118.super_MessageBuilder);
    local_188.segment = (SegmentBuilder *)AVar2.ptr[2].size_;
    kj::_::Debug::log<char_const(&)[68],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x40c,ERROR,
               "\"failed: expected \" \"(2u) == (builder.getSegmentsForOutput()[2].size())\", 2u, builder.getSegmentsForOutput()[2].size()"
               ,(char (*) [68])"failed: expected (2u) == (builder.getSegmentsForOutput()[2].size())"
               ,(uint *)&local_1a0,(unsigned_long *)&local_188);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return;
}

Assistant:

TEST(Encoding, UpgradeStructInBuilderDoubleFarPointers) {
  // Force allocation of a double-Far pointer.

  MallocMessageBuilder builder(6, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<test::TestAnyPointer>();

  root.getAnyPointerField().initAs<test::TestOldVersion>().setOld2("foo");

  // We should have allocated all of the first segment.
  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[0].size());

  // Now if we upgrade...
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<test::TestNewVersion>().getOld2());

  // We should have allocated the new struct in a new segment, and also allocated the far pointer
  // landing pad in yet another segment.
  ASSERT_EQ(3u, builder.getSegmentsForOutput().size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[0].size());
  EXPECT_EQ(6u, builder.getSegmentsForOutput()[1].size());
  EXPECT_EQ(2u, builder.getSegmentsForOutput()[2].size());
}